

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

Bool InsertMisc(Node *element,Node *node)

{
  Bool BVar1;
  bool bVar2;
  TidyTagId local_30;
  Node *local_28;
  Node *root;
  Node *node_local;
  Node *element_local;
  
  if (((((node->type == CommentTag) || (node->type == ProcInsTag)) || (node->type == CDATATag)) ||
      ((node->type == SectionTag || (node->type == AspTag)))) ||
     ((node->type == JsteTag || (node->type == PhpTag)))) {
    prvTidyInsertNodeAtEnd(element,node);
    element_local._4_4_ = yes;
  }
  else {
    local_28 = element;
    if (node->type == XmlDecl) {
      while( true ) {
        bVar2 = false;
        if (local_28 != (Node *)0x0) {
          bVar2 = local_28->parent != (Node *)0x0;
        }
        if (!bVar2) break;
        local_28 = local_28->parent;
      }
      if ((local_28 != (Node *)0x0) &&
         ((local_28->content == (Node *)0x0 || (local_28->content->type != XmlDecl)))) {
        prvTidyInsertNodeAtStart(local_28,node);
        return yes;
      }
    }
    if (((node->tag != (Dict *)0x0) && (BVar1 = prvTidynodeIsElement(node), BVar1 != no)) &&
       (BVar1 = prvTidynodeCMIsEmpty(node), BVar1 != no)) {
      if ((node == (Node *)0x0) || (node->tag == (Dict *)0x0)) {
        local_30 = TidyTag_UNKNOWN;
      }
      else {
        local_30 = node->tag->id;
      }
      if ((local_30 == TidyTag_UNKNOWN) && ((node->tag->versions & 0xe000) != 0)) {
        prvTidyInsertNodeAtEnd(element,node);
        return yes;
      }
    }
    element_local._4_4_ = no;
  }
  return element_local._4_4_;
}

Assistant:

static Bool InsertMisc(Node *element, Node *node)
{
    if (node->type == CommentTag ||
        node->type == ProcInsTag ||
        node->type == CDATATag ||
        node->type == SectionTag ||
        node->type == AspTag ||
        node->type == JsteTag ||
        node->type == PhpTag )
    {
        TY_(InsertNodeAtEnd)(element, node);
        return yes;
    }

    if ( node->type == XmlDecl )
    {
        Node* root = element;
        while ( root && root->parent )
            root = root->parent;
        if ( root && !(root->content && root->content->type == XmlDecl))
        {
          TY_(InsertNodeAtStart)( root, node );
          return yes;
        }
    }

    /* Declared empty tags seem to be slipping through
    ** the cracks.  This is an experiment to figure out
    ** a decent place to pick them up.
    */
    if ( node->tag &&
         TY_(nodeIsElement)(node) &&
         TY_(nodeCMIsEmpty)(node) && TagId(node) == TidyTag_UNKNOWN &&
         (node->tag->versions & VERS_PROPRIETARY) != 0 )
    {
        TY_(InsertNodeAtEnd)(element, node);
        return yes;
    }

    return no;
}